

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cpp
# Opt level: O0

bool __thiscall
Filesystem::make_dir
          (Filesystem *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *paths)

{
  Fcb fcb;
  bool bVar1;
  int iVar2;
  reference __lhs;
  reference pvVar3;
  size_type sVar4;
  reference pvVar5;
  char *pcVar6;
  unsigned_short *puVar7;
  ostream *this_00;
  undefined1 auStack_110 [4];
  int newBlock;
  Fcb newFcb;
  vector<Fcb,_std::allocator<Fcb>_> local_e0;
  undefined1 local_c8 [8];
  vector<Fcb,_std::allocator<Fcb>_> vec;
  int local_a8;
  int local_a4;
  int i;
  int j;
  string needtoMake;
  int blockId;
  bool findFlag;
  Fcb curFcb;
  Document *local_40;
  Document *curDir;
  const_iterator local_30;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_28;
  iterator it;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *paths_local;
  Filesystem *this_local;
  
  it._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paths;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(paths);
  if (!bVar1) {
    local_28._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(paths);
    __lhs = __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(&local_28);
    bVar1 = std::operator==(__lhs,"");
    if (bVar1) {
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_30,&local_28);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::erase(paths,local_30);
    }
  }
  local_40 = (Document *)operator_new(0x20);
  Document::Document(local_40,this->proot);
  needtoMake.field_2._M_local_buf[0xf] = '\0';
  needtoMake.field_2._8_4_ = 5;
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::back(paths);
  std::__cxx11::string::string((string *)&i,(string *)pvVar3);
  local_a4 = 0;
  do {
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(paths);
    if (sVar4 - 1 <= (ulong)(long)local_a4) {
      Document::save(local_40);
      if ((local_40->pos != this->proot->pos) && (local_40 != (Document *)0x0)) {
        Document::~Document(local_40);
        operator_delete(local_40,0x20);
      }
      iVar2 = Fat::get_FreeBlock(this->pfat1);
      puVar7 = Fat::operator[](this->pfat1,iVar2);
      *puVar7 = 0xffff;
      pcVar6 = (char *)std::__cxx11::string::c_str();
      initFcb((Fcb *)auStack_110,pcVar6,"",'\0',0,0,iVar2,0,'\x01');
      fcb._8_8_ = newFcb.filename;
      fcb.filename[0] = auStack_110[0];
      fcb.filename[1] = auStack_110[1];
      fcb.filename[2] = auStack_110[2];
      fcb.filename[3] = auStack_110[3];
      fcb.filename[4] = (char)newBlock;
      fcb.filename[5] = newBlock._1_1_;
      fcb.filename[6] = newBlock._2_1_;
      fcb.filename[7] = newBlock._3_1_;
      fcb.first = newFcb._8_4_;
      fcb._20_4_ = newFcb._12_4_;
      fcb.length = newFcb._16_8_;
      fcb._32_8_ = newFcb.length;
      bVar1 = add_fcb(this,needtoMake.field_2._8_4_,fcb);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        this_00 = std::operator<<((ostream *)&std::cout,"[Err]Cannot make this fold!");
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        this_local._7_1_ = false;
      }
LAB_0010b006:
      vec.super__Vector_base<Fcb,_std::allocator<Fcb>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = 1;
      std::__cxx11::string::~string((string *)&i);
      return this_local._7_1_;
    }
    for (local_a8 = 0; sVar4 = std::vector<Fcb,_std::allocator<Fcb>_>::size(&local_40->fcbList),
        (ulong)(long)local_a8 < sVar4; local_a8 = local_a8 + 1) {
      pvVar5 = std::vector<Fcb,_std::allocator<Fcb>_>::operator[](&local_40->fcbList,(long)local_a8)
      ;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](paths,(long)local_a4);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      iVar2 = strcmp(pvVar5->filename,pcVar6);
      if ((iVar2 == 0) &&
         (pvVar5 = std::vector<Fcb,_std::allocator<Fcb>_>::operator[]
                             (&local_40->fcbList,(long)local_a8), pvVar5->attribute == '\0')) {
        needtoMake.field_2._M_local_buf[0xf] = '\x01';
        pvVar5 = std::vector<Fcb,_std::allocator<Fcb>_>::operator[]
                           (&local_40->fcbList,(long)local_a8);
        memcpy(&blockId,pvVar5,0x28);
        needtoMake.field_2._8_1_ = curFcb.exname[0];
        needtoMake.field_2._9_1_ = curFcb.exname[1];
        needtoMake.field_2._10_1_ = curFcb.exname[2];
        needtoMake.field_2._11_1_ = curFcb.attribute;
        break;
      }
    }
    if ((needtoMake.field_2._M_local_buf[0xf] & 1U) == 0) {
      this_local._7_1_ = false;
      goto LAB_0010b006;
    }
    if ((local_40->pos != this->proot->pos) && (local_40 != (Document *)0x0)) {
      Document::~Document(local_40);
      operator_delete(local_40,0x20);
    }
    copy_file_vec((vector<Fcb,_std::allocator<Fcb>_> *)local_c8,this,needtoMake.field_2._8_4_);
    local_40 = (Document *)operator_new(0x20);
    newFcb._39_1_ = 1;
    std::vector<Fcb,_std::allocator<Fcb>_>::vector
              (&local_e0,(vector<Fcb,_std::allocator<Fcb>_> *)local_c8);
    Document::Document(local_40,&local_e0);
    newFcb._39_1_ = 0;
    std::vector<Fcb,_std::allocator<Fcb>_>::~vector(&local_e0);
    needtoMake.field_2._M_local_buf[0xf] = '\0';
    std::vector<Fcb,_std::allocator<Fcb>_>::~vector((vector<Fcb,_std::allocator<Fcb>_> *)local_c8);
    local_a4 = local_a4 + 1;
  } while( true );
}

Assistant:

bool Filesystem::make_dir(vector<string> paths)
{

    if (!paths.empty())
    {
        auto it = paths.begin();
        if (*it == "")
            paths.erase(it);
    }


    Document *curDir = new Document(*proot);
    Fcb curFcb;
    bool findFlag = false;
    int blockId = 5;

   blockId = 5;


    string needtoMake = paths.back();

    for(int j=0;j<paths.size()-1;j++)
    {
        // search curDir
        for (int i = 0; i < curDir->fcbList.size(); ++i)
        {
            if (strcmp(curDir->fcbList[i].filename,paths[j].c_str()) ==0)
            {
                if (curDir->fcbList[i].attribute==0)
                {
                    findFlag = true;
                    curFcb = curDir->fcbList[i];
                    blockId = curFcb.first;
                    break;
                }

            }
        }
        if (!findFlag)
        {
            return false;
        }
        else
        {
            if (curDir->pos != proot->pos)
                delete curDir;
            auto vec = copy_file_vec(blockId);

            curDir = new Document(vec);
            findFlag = false;
        }
    }

    curDir->save();
    if (curDir->pos!=proot->pos)
        delete curDir;

    /// create the file in curDir
    Fcb newFcb;
    //allocate new block
    int newBlock = pfat1->get_FreeBlock();
    (*pfat1)[newBlock] = END;
    initFcb(newFcb,needtoMake.c_str(),"",0,0,0,newBlock,0,1);
    if(!add_fcb(blockId,newFcb))
    {
        cout << "[Err]Cannot make this fold!"<<endl;
        return false;
    }



    return true;

}